

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::SharedBuffers::allocate(SharedBuffers *this,size_t nInputs,size_t nOutputs)

{
  bool bVar1;
  unsigned_long local_50;
  shared_ptr<std::valarray<float>_> local_48;
  unsigned_long local_38;
  shared_ptr<std::valarray<float>_> local_30;
  size_t local_20;
  size_t nOutputs_local;
  size_t nInputs_local;
  SharedBuffers *this_local;
  
  local_20 = nOutputs;
  nOutputs_local = nInputs;
  nInputs_local = (size_t)this;
  bVar1 = ready(this);
  if (!bVar1) {
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (!bVar1) {
      local_38 = 0;
      ::std::make_shared<std::valarray<float>,double,unsigned_long&>((double *)&local_30,&local_38);
      std::shared_ptr<std::valarray<float>_>::operator=(&this->inputBuffer,&local_30);
      std::shared_ptr<std::valarray<float>_>::~shared_ptr(&local_30);
    }
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->outputBuffer);
    if (!bVar1) {
      local_50 = 0;
      ::std::make_shared<std::valarray<float>,double,unsigned_long&>((double *)&local_48,&local_50);
      std::shared_ptr<std::valarray<float>_>::operator=(&this->outputBuffer,&local_48);
      std::shared_ptr<std::valarray<float>_>::~shared_ptr(&local_48);
    }
  }
  return;
}

Assistant:

void allocate(size_t nInputs, size_t nOutputs) {
        if (ready()) {
            return;
        }
        if (!inputBuffer) {
            inputBuffer = std::make_shared<Array>(0.0, nInputs);
        }
        if (!outputBuffer) {
            outputBuffer = std::make_shared<Array>(0.0, nOutputs);
        }
    }